

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.cpp
# Opt level: O3

uint32_t FNV32a_YoshimitsuTRIAD(char *key,int len,uint32_t seed)

{
  uint *puVar1;
  uint *puVar2;
  uint *puVar3;
  uint *puVar4;
  uint *puVar5;
  ushort *puVar6;
  uint uVar7;
  uint uVar9;
  uint *puVar10;
  uint uVar11;
  uint8_t *p;
  uint uVar12;
  uint uVar8;
  
  uVar12 = 0x811c9dc5;
  uVar11 = seed ^ 0x811c9dc5;
  uVar9 = len + 0x811c9dc5;
  puVar10 = (uint *)key;
  if (0x17 < (uint)len) {
    uVar12 = 0x811c9dc5;
    do {
      uVar7 = *puVar10;
      uVar8 = *puVar10;
      puVar1 = puVar10 + 1;
      puVar2 = puVar10 + 2;
      puVar3 = puVar10 + 3;
      puVar4 = puVar10 + 4;
      puVar5 = puVar10 + 5;
      len = len - 0x18;
      puVar10 = puVar10 + 6;
      uVar11 = (uVar11 ^ *puVar1 ^ (uVar7 >> 0x1b | uVar8 << 5)) * 0xad3e7;
      uVar9 = (uVar9 ^ *puVar3 ^ (*puVar2 >> 0x1b | *puVar2 << 5)) * 0xad3e7;
      uVar12 = (uVar12 ^ *puVar5 ^ (*puVar4 >> 0x1b | *puVar4 << 5)) * 0xad3e7;
    } while (0x17 < (uint)len);
  }
  uVar12 = ((uVar12 >> 0x1b | uVar12 << 5) ^ uVar11) * 0xad3e7;
  if (puVar10 == (uint *)key) {
    uVar12 = uVar11;
  }
  if (0xf < (uint)len) {
    uVar11 = *puVar10;
    uVar7 = *puVar10;
    puVar1 = puVar10 + 2;
    puVar2 = puVar10 + 1;
    puVar3 = puVar10 + 3;
    puVar10 = puVar10 + 4;
    uVar12 = ((uVar11 >> 0x1b | uVar7 << 5) ^ *puVar2 ^ uVar12) * 0xad3e7;
    uVar9 = ((*puVar1 >> 0x1b | *puVar1 << 5) ^ *puVar3 ^ uVar9) * 0xad3e7;
  }
  if ((len & 8U) != 0) {
    uVar11 = *puVar10;
    puVar1 = puVar10 + 1;
    puVar10 = puVar10 + 2;
    uVar12 = (uVar12 ^ uVar11) * 0xad3e7;
    uVar9 = (uVar9 ^ *puVar1) * 0xad3e7;
  }
  if ((len & 4U) != 0) {
    uVar11 = *puVar10;
    puVar6 = (ushort *)((long)puVar10 + 2);
    puVar10 = puVar10 + 1;
    uVar12 = (uVar12 ^ (ushort)uVar11) * 0xad3e7;
    uVar9 = (uVar9 ^ *puVar6) * 0xad3e7;
  }
  if ((len & 2U) != 0) {
    uVar11 = *puVar10;
    puVar10 = (uint *)((long)puVar10 + 2);
    uVar12 = (uVar12 ^ (ushort)uVar11) * 0xad3e7;
  }
  if ((len & 1U) != 0) {
    uVar12 = (uVar12 ^ (byte)*puVar10) * 0xad3e7;
  }
  uVar9 = ((uVar9 >> 0x1b | uVar9 << 5) ^ uVar12) * 0xad3e7;
  return uVar9 >> 0x10 ^ uVar9;
}

Assistant:

uint32_t
FNV32a_YoshimitsuTRIAD(const char *key, int len, uint32_t seed)
{
  const uint8_t  *p = (const uint8_t *)key;
  const uint32_t  PRIME = 709607;
  uint32_t	  hash32A = seed ^ UINT32_C(2166136261);
  uint32_t	  hash32B = UINT32_C(2166136261) + len;
  uint32_t	  hash32C = UINT32_C(2166136261);

  for (; len >= 3 * 2 * sizeof(uint32_t); len -= 3 * 2 * sizeof(uint32_t), p += 3 * 2 * sizeof(uint32_t)) {
    hash32A = (hash32A ^ (ROTL32(*(uint32_t *) (p + 0), 5)  ^ *(uint32_t *) (p + 4)))  * PRIME;
    hash32B = (hash32B ^ (ROTL32(*(uint32_t *) (p + 8), 5)  ^ *(uint32_t *) (p + 12))) * PRIME;
    hash32C = (hash32C ^ (ROTL32(*(uint32_t *) (p + 16), 5) ^ *(uint32_t *) (p + 20))) * PRIME;
  }
  if (p != (const uint8_t *)key) {
    hash32A = (hash32A ^ ROTL32(hash32C, 5)) * PRIME;
  }
  //Cases 0. .31
  if (len & 4 * sizeof(uint32_t)) {
    hash32A = (hash32A ^ (ROTL32(*(uint32_t *) (p + 0), 5) ^ *(uint32_t *) (p + 4))) * PRIME;
    hash32B = (hash32B ^ (ROTL32(*(uint32_t *) (p + 8), 5) ^ *(uint32_t *) (p + 12))) * PRIME;
    p += 8 * sizeof(uint16_t);
  }
  //Cases 0. .15
  if (len & 2 * sizeof(uint32_t)) {
    hash32A = (hash32A ^ *(uint32_t *) (p + 0)) * PRIME;
    hash32B = (hash32B ^ *(uint32_t *) (p + 4)) * PRIME;
    p += 4 * sizeof(uint16_t);
  }
  //Cases:0. .7
  if (len & sizeof(uint32_t)) {
    hash32A = (hash32A ^ *(uint16_t *) (p + 0)) * PRIME;
    hash32B = (hash32B ^ *(uint16_t *) (p + 2)) * PRIME;
    p += 2 * sizeof(uint16_t);
  }
  //Cases:0. .3
  if (len & sizeof(uint16_t)) {
    hash32A = (hash32A ^ *(uint16_t *) p) * PRIME;
    p += sizeof(uint16_t);
  }
  if (len & 1)
    hash32A = (hash32A ^ *p) * PRIME;

  hash32A = (hash32A ^ ROTL32(hash32B, 5)) * PRIME;
  return hash32A ^ (hash32A >> 16);
}